

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fiosav_voc_cb(void *ctx0,vocdef *voc,vocwdef *vocw)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  uint16_t tmp;
  size_t sVar14;
  char buf [10];
  uchar local_1a;
  byte local_19;
  undefined4 local_18;
  objnum local_14;
  
  local_19 = vocw->vocwflg;
  if ((local_19 & 0xc) != 0) {
    local_1a = vocw->vocwtyp;
    uVar1._0_1_ = voc->voclen;
    uVar1._1_1_ = voc->vocln2;
    uVar1._2_2_ = *(undefined2 *)&voc->field_0xa;
    uVar1._4_4_ = voc->vocwlst;
    auVar2._8_6_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2[0xe] = (char)((uint)uVar1._4_4_ >> 0x18);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xc] = (char)((uint)uVar1._4_4_ >> 0x10);
    auVar3._13_2_ = auVar2._13_2_;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5._8_2_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[10] = (char)((uint)uVar1._4_4_ >> 8);
    auVar5._11_4_ = auVar4._11_4_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = (char)uVar1._4_4_;
    auVar7._0_8_ = uVar1;
    auVar7._9_6_ = auVar6._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar7._8_7_;
    auVar10._8_7_ = 0;
    auVar10._0_8_ = SUB158(auVar9 << 0x40,7);
    auVar11._9_6_ = 0;
    auVar11._0_9_ = SUB159(auVar10 << 0x38,6);
    auVar12._10_5_ = 0;
    auVar12._0_10_ = SUB1510(auVar11 << 0x30,5);
    auVar13._11_4_ = 0;
    auVar13._0_11_ = SUB1511(auVar12 << 0x28,4);
    auVar8._3_12_ = SUB1512(auVar13 << 0x20,3);
    auVar8[2] = uVar1._1_1_;
    auVar8[1] = 0;
    auVar8[0] = (undefined1)uVar1;
    local_18 = auVar8._0_4_;
    local_14 = vocw->vocwobj;
    sVar14 = fwrite(&local_1a,8,1,*(FILE **)((long)ctx0 + 8));
    if (sVar14 != 1) {
      *(undefined4 *)ctx0 = 1;
    }
    sVar14 = fwrite(voc->voctxt,(ulong)voc->vocln2 + (ulong)voc->voclen,1,*(FILE **)((long)ctx0 + 8)
                   );
    if (sVar14 != 1) {
      *(undefined4 *)ctx0 = 1;
    }
  }
  return;
}

Assistant:

static void fiosav_voc_cb(void *ctx0, vocdef *voc, vocwdef *vocw)
{
    struct fiosav_cb_ctx *ctx = (struct fiosav_cb_ctx *)ctx0;
    char buf[10];
    
    /* if the word was dynamically allocated or deleted, save it */
    if ((vocw->vocwflg & VOCFNEW) || (vocw->vocwflg & VOCFDEL))
    {
        /* write the header information */
        buf[0] = vocw->vocwtyp;
        buf[1] = vocw->vocwflg;
        oswp2(buf+2, voc->voclen);
        oswp2(buf+4, voc->vocln2);
        oswp2(buf+6, vocw->vocwobj);
        if (osfwb(ctx->fp, buf, 8)) ctx->err = TRUE;

        /* write the words */
        if (osfwb(ctx->fp, voc->voctxt, voc->voclen + voc->vocln2))
            ctx->err = TRUE;
    }
}